

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>_>
::~UnorderedElementsAreMatcher
          (UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  
  plVar2 = (long *)(this->matchers_).
                   super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                   .
                   super__Head_base<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
                   ._M_head_impl.first_matcher_.impl_.whose_field_._M_dataplus._M_p;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(this->matchers_).
                      super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                      .
                      super__Head_base<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
                      ._M_head_impl.first_matcher_.impl_.whose_field_ + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar2 != paVar1) {
    operator_delete(plVar2,paVar1->_M_allocated_capacity + 1);
  }
  MatcherBase<const_int_&>::~MatcherBase
            (&(this->matchers_).
              super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
              .
              super__Head_base<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
              ._M_head_impl.first_matcher_.impl_.matcher_.super_MatcherBase<const_int_&>);
  plVar2 = (long *)(((string *)
                    ((long)&(this->matchers_).
                            super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                            .
                            super__Tuple_impl<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                            .
                            super__Head_base<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
                            ._M_head_impl.first_matcher_.impl_ + 0x20))->_M_dataplus)._M_p;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(this->matchers_).
                      super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                      .
                      super__Head_base<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
                      ._M_head_impl.first_matcher_.impl_ + 0x30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar2 != paVar1) {
    operator_delete(plVar2,paVar1->_M_allocated_capacity + 1);
  }
  MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)
             ((long)&(this->matchers_).
                     super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                     .
                     super__Tuple_impl<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                     .
                     super__Head_base<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
                     ._M_head_impl.first_matcher_.impl_ + 8));
  plVar2 = (long *)(((string *)
                    ((long)&(this->matchers_).
                            super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                            .
                            super__Tuple_impl<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                            .
                            super__Tuple_impl<2UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                            .
                            super__Head_base<2UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
                            ._M_head_impl.first_matcher_ + 0x20))->_M_dataplus)._M_p;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(this->matchers_).
                      super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                      .
                      super__Tuple_impl<2UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                      .
                      super__Head_base<2UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
                      ._M_head_impl.first_matcher_ + 0x30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar2 != paVar1) {
    operator_delete(plVar2,paVar1->_M_allocated_capacity + 1);
  }
  MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)
             ((long)&(this->matchers_).
                     super__Tuple_impl<0UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                     .
                     super__Tuple_impl<1UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                     .
                     super__Tuple_impl<2UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>_>
                     .
                     super__Head_base<2UL,_testing::internal::PairMatcher<testing::PolymorphicMatcher<testing::internal::FieldMatcher<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_int>,_false>
                     ._M_head_impl.first_matcher_ + 8));
  return;
}

Assistant:

explicit UnorderedElementsAreMatcher(const MatcherTuple& args)
      : matchers_(args) {}